

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

void mtbdd_gc_mark_protected_CALL(WorkerP *w,Task *__dq_head)

{
  MTBDD *pMVar1;
  Task *__dq_head_local;
  WorkerP *w_local;
  BDD *to_mark;
  uint64_t *it;
  size_t count;
  WorkerP *local_10;
  
  it = (uint64_t *)0x0;
  count = (size_t)__dq_head;
  local_10 = w;
  to_mark = protect_iter(&mtbdd_protected,0,mtbdd_protected.refs_size);
  while (to_mark != (BDD *)0x0) {
    pMVar1 = (MTBDD *)protect_next(&mtbdd_protected,&to_mark,mtbdd_protected.refs_size);
    mtbdd_gc_mark_rec_SPAWN(local_10,(Task *)count,*pMVar1);
    count = count + 0x40;
    it = (uint64_t *)((long)it + 1);
  }
  while (it != (uint64_t *)0x0) {
    count = count - 0x40;
    it = (uint64_t *)((long)it + -1);
    mtbdd_gc_mark_rec_SYNC(local_10,(Task *)count);
  }
  return;
}

Assistant:

VOID_TASK_0(mtbdd_gc_mark_protected)
{
    // iterate through refs hash table, mark all found
    size_t count=0;
    uint64_t *it = protect_iter(&mtbdd_protected, 0, mtbdd_protected.refs_size);
    while (it != NULL) {
        BDD *to_mark = (BDD*)protect_next(&mtbdd_protected, &it, mtbdd_protected.refs_size);
        SPAWN(mtbdd_gc_mark_rec, *to_mark);
        count++;
    }
    while (count--) {
        SYNC(mtbdd_gc_mark_rec);
    }
}